

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portfwd.c
# Opt level: O1

void portfwdmgr_config(PortFwdManager *mgr,Conf *conf)

{
  byte bVar1;
  PortListener *ptr;
  LogContext *ctx;
  _Bool _Var2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  Conf *pCVar6;
  undefined4 *puVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  size_t sVar12;
  PortFwdRecord *pPVar13;
  PortFwdRecord *pPVar14;
  ssh_rportfwd *psVar15;
  uint uVar16;
  undefined4 uVar17;
  int iVar19;
  byte bVar20;
  char *pcVar21;
  byte *s;
  ssh_rportfwd **ppsVar22;
  byte bVar23;
  bool bVar24;
  char *local_68;
  char *local_50;
  char *key;
  undefined4 local_3c;
  char *local_38;
  ulong uVar18;
  
  if (mgr->conf != (Conf *)0x0) {
    conf_free(mgr->conf);
  }
  pCVar6 = conf_copy(conf);
  mgr->conf = pCVar6;
  puVar7 = (undefined4 *)index234(mgr->forwardings,0);
  if (puVar7 != (undefined4 *)0x0) {
    iVar19 = 1;
    do {
      *puVar7 = 0;
      puVar7 = (undefined4 *)index234(mgr->forwardings,iVar19);
      iVar19 = iVar19 + 1;
    } while (puVar7 != (undefined4 *)0x0);
  }
  pcVar8 = conf_get_str_strs(conf,0xb0,(char *)0x0,&key);
  while (pcVar8 != (char *)0x0) {
    uVar16 = (byte)*key - 0x34;
    uVar18 = (ulong)uVar16;
    s = (byte *)key;
    bVar20 = 0x41;
    if ((uVar16 < 0xe) && ((0x2005U >> (uVar16 & 0x1f) & 1) != 0)) {
      s = (byte *)key + 1;
      bVar20 = *key;
    }
    bVar1 = *s;
    if ((bVar1 == 0x52) || (bVar23 = 0x4c, bVar1 == 0x4c)) {
      s = s + 1;
      bVar23 = bVar1;
    }
    pcVar9 = host_strchr((char *)s,0x3a);
    if (pcVar9 == (char *)0x0) {
      pcVar11 = (char *)0x0;
    }
    else {
      pcVar10 = dupprintf("%.*s",(ulong)(uint)((int)pcVar9 - (int)s),s);
      pcVar11 = host_strduptrim(pcVar10);
      safefree(pcVar10);
      s = (byte *)(pcVar9 + 1);
    }
    uVar3 = atoi((char *)s);
    uVar16 = uVar3;
    if ((uVar3 == 0) && (uVar16 = net_service_lookup((char *)s), uVar16 == 0)) {
      logeventf(mgr->cl->logctx,"Service lookup failed for source port \"%s\"",s);
      uVar16 = 0;
    }
    local_38 = pcVar11;
    if ((bVar23 == 0x4c) && (iVar19 = strcmp(pcVar8,"D"), iVar19 == 0)) {
      uVar17 = (undefined4)CONCAT71((int7)(uVar18 >> 8),1);
      uVar4 = 0xffffffff;
      bVar23 = 0x44;
      pcVar8 = (char *)0x0;
      local_50 = (char *)0x0;
    }
    else {
      sVar12 = host_strcspn(pcVar8,":");
      local_50 = dupprintf("%.*s",sVar12 & 0xffffffff,pcVar8);
      pcVar8 = pcVar8 + ((sVar12 + 1) - (ulong)(pcVar8[sVar12] == '\0'));
      uVar4 = atoi(pcVar8);
      if (uVar4 == 0) {
        uVar5 = net_service_lookup(pcVar8);
        uVar4 = 0;
        if (uVar5 == 0) {
          logeventf(mgr->cl->logctx,"Service lookup failed for destination port \"%s\"",pcVar8);
          uVar17 = 0;
        }
        else {
          uVar17 = 0;
          uVar4 = uVar5;
        }
      }
      else {
        uVar17 = (undefined4)CONCAT71((int7)(uVar18 >> 8),1);
      }
    }
    if ((uVar16 == 0) || (uVar4 == 0)) {
      safefree(local_38);
      safefree(local_50);
    }
    else {
      local_3c = uVar17;
      pPVar13 = (PortFwdRecord *)safemalloc(1,0x48,0);
      pPVar13->type = (int)(char)bVar23;
      pPVar13->saddr = local_38;
      pcVar9 = (char *)0x0;
      if (uVar3 == 0) {
        pcVar9 = dupstr((char *)s);
      }
      pPVar13->sserv = pcVar9;
      pPVar13->sport = uVar16;
      pPVar13->daddr = local_50;
      if ((char)local_3c == '\0') {
        pcVar8 = dupstr(pcVar8);
      }
      else {
        pcVar8 = (char *)0x0;
      }
      pPVar13->dserv = pcVar8;
      pPVar13->dport = uVar4;
      pPVar13->local = (PortListener *)0x0;
      pPVar13->remote = (ssh_rportfwd *)0x0;
      iVar19 = (uint)(bVar20 == 0x36) * 2;
      if (bVar20 == 0x34) {
        iVar19 = 1;
      }
      pPVar13->addressfamily = iVar19;
      pPVar14 = (PortFwdRecord *)add234(mgr->forwardings,pPVar13);
      if (pPVar14 == pPVar13) {
        pPVar13->status = CREATE;
      }
      else {
        if (pPVar14->status == DESTROY) {
          pPVar14->status = KEEP;
        }
        pfr_free(pPVar13);
      }
    }
    pcVar8 = conf_get_str_strs(conf,0xb0,key,&key);
  }
  pPVar13 = (PortFwdRecord *)index234(mgr->forwardings,0);
  if (pPVar13 != (PortFwdRecord *)0x0) {
    iVar19 = 0;
    do {
      if (pPVar13->status == DESTROY) {
        pcVar8 = "dynamic";
        if (pPVar13->type == 0x52) {
          pcVar8 = "remote";
        }
        if (pPVar13->type == 0x4c) {
          pcVar8 = "local";
        }
        pcVar9 = pPVar13->saddr;
        bVar24 = pcVar9 == (char *)0x0;
        if (bVar24) {
          pcVar9 = "";
        }
        pcVar11 = ":";
        if (bVar24) {
          pcVar11 = "";
        }
        pcVar9 = dupprintf("%s port forwarding from %s%s%d",pcVar8,pcVar9,pcVar11,
                           (ulong)pPVar13->sport);
        pcVar8 = pcVar9;
        if (pPVar13->type != 0x44) {
          pcVar8 = dupprintf("%s to %s:%d",pcVar9,pPVar13->daddr,(ulong)pPVar13->dport);
          safefree(pcVar9);
        }
        logeventf(mgr->cl->logctx,"Cancelling %s",pcVar8);
        safefree(pcVar8);
        if (pPVar13->remote == (ssh_rportfwd *)0x0) {
          ptr = pPVar13->local;
          if (ptr != (PortListener *)0x0) {
            ppsVar22 = (ssh_rportfwd **)&pPVar13->local;
            (*ptr->s->vt->close)(ptr->s);
            safefree(ptr->hostname);
            safefree(ptr);
            goto LAB_0011fa1c;
          }
        }
        else {
          ppsVar22 = &pPVar13->remote;
          (*mgr->cl->vt->rportfwd_remove)(mgr->cl,pPVar13->remote);
LAB_0011fa1c:
          *ppsVar22 = (ssh_rportfwd *)0x0;
        }
        delpos234(mgr->forwardings,iVar19);
        pfr_free(pPVar13);
        iVar19 = iVar19 + -1;
      }
      iVar19 = iVar19 + 1;
      pPVar13 = (PortFwdRecord *)index234(mgr->forwardings,iVar19);
    } while (pPVar13 != (PortFwdRecord *)0x0);
  }
  pPVar13 = (PortFwdRecord *)index234(mgr->forwardings,0);
  if (pPVar13 != (PortFwdRecord *)0x0) {
    iVar19 = 1;
    do {
      if (pPVar13->status == CREATE) {
        pcVar8 = pPVar13->saddr;
        bVar24 = pcVar8 == (char *)0x0;
        if (bVar24) {
          pcVar8 = "";
        }
        pcVar9 = ":";
        if (bVar24) {
          pcVar9 = "";
        }
        pcVar11 = pPVar13->sserv;
        bVar24 = pcVar11 == (char *)0x0;
        if (bVar24) {
          pcVar11 = "";
        }
        pcVar10 = "(";
        if (bVar24) {
          pcVar10 = "";
        }
        pcVar21 = ")";
        if (bVar24) {
          pcVar21 = "";
        }
        pcVar8 = dupprintf("%s%s%s%s%d%s",pcVar8,pcVar9,pcVar11,pcVar10,(ulong)pPVar13->sport,
                           pcVar21);
        if (pPVar13->type == 0x44) {
          local_68 = (char *)0x0;
        }
        else {
          pcVar9 = pPVar13->dserv;
          bVar24 = pcVar9 == (char *)0x0;
          if (bVar24) {
            pcVar9 = "";
          }
          pcVar11 = "(";
          if (bVar24) {
            pcVar11 = "";
          }
          pcVar10 = ")";
          if (bVar24) {
            pcVar10 = "";
          }
          local_68 = dupprintf("%s:%s%s%d%s",pPVar13->daddr,pcVar9,pcVar11,(ulong)pPVar13->dport,
                               pcVar10);
        }
        if (pPVar13->type == 0x44) {
          pcVar9 = pfl_listen((char *)0x0,-1,pPVar13->saddr,pPVar13->sport,mgr->cl,conf,
                              &pPVar13->local,pPVar13->addressfamily);
          pcVar11 = "";
          if (pPVar13->addressfamily == 2) {
            pcVar11 = "IPv6 ";
          }
          if (pPVar13->addressfamily == 1) {
            pcVar11 = "IPv4 ";
          }
          pcVar10 = " failed: ";
          if (pcVar9 == (char *)0x0) {
            pcVar10 = "";
          }
          pcVar21 = pcVar9;
          if (pcVar9 == (char *)0x0) {
            pcVar21 = "";
          }
          logeventf(mgr->cl->logctx,"Local %sport %s SOCKS dynamic forwarding%s%s",pcVar11,pcVar8,
                    pcVar10,pcVar21);
joined_r0x0011fc8f:
          if (pcVar9 != (char *)0x0) {
            safefree(pcVar9);
          }
        }
        else {
          if (pPVar13->type == 0x4c) {
            pcVar9 = pfl_listen(pPVar13->daddr,pPVar13->dport,pPVar13->saddr,pPVar13->sport,mgr->cl,
                                conf,&pPVar13->local,pPVar13->addressfamily);
            pcVar11 = "";
            if (pPVar13->addressfamily == 2) {
              pcVar11 = "IPv6 ";
            }
            if (pPVar13->addressfamily == 1) {
              pcVar11 = "IPv4 ";
            }
            pcVar10 = " failed: ";
            if (pcVar9 == (char *)0x0) {
              pcVar10 = "";
            }
            pcVar21 = pcVar9;
            if (pcVar9 == (char *)0x0) {
              pcVar21 = "";
            }
            logeventf(mgr->cl->logctx,"Local %sport %s forwarding to %s%s%s",pcVar11,pcVar8,local_68
                      ,pcVar10,pcVar21);
            goto joined_r0x0011fc8f;
          }
          pcVar9 = pPVar13->saddr;
          if (pcVar9 == (char *)0x0) {
            _Var2 = conf_get_bool(conf,0xaf);
            pcVar9 = "localhost";
            if (_Var2) {
              pcVar9 = "";
            }
          }
          psVar15 = (*mgr->cl->vt->rportfwd_alloc)
                              (mgr->cl,pcVar9,pPVar13->sport,pPVar13->daddr,pPVar13->dport,
                               pPVar13->addressfamily,pcVar8,pPVar13,(ssh_sharing_connstate *)0x0);
          pPVar13->remote = psVar15;
          ctx = mgr->cl->logctx;
          if (psVar15 == (ssh_rportfwd *)0x0) {
            logeventf(ctx,"Duplicate remote port forwarding to %s:%d",pPVar13->daddr,
                      (ulong)pPVar13->dport);
            pfr_free(pPVar13);
          }
          else {
            logeventf(ctx,"Requesting remote port %s forward to %s",pcVar8,local_68);
          }
        }
        safefree(pcVar8);
        safefree(local_68);
      }
      pPVar13 = (PortFwdRecord *)index234(mgr->forwardings,iVar19);
      iVar19 = iVar19 + 1;
    } while (pPVar13 != (PortFwdRecord *)0x0);
  }
  return;
}

Assistant:

void portfwdmgr_config(PortFwdManager *mgr, Conf *conf)
{
    PortFwdRecord *pfr;
    int i;
    char *key, *val;

    if (mgr->conf)
        conf_free(mgr->conf);
    mgr->conf = conf_copy(conf);

    /*
     * Go through the existing port forwardings and tag them
     * with status==DESTROY. Any that we want to keep will be
     * re-enabled (status==KEEP) as we go through the
     * configuration and find out which bits are the same as
     * they were before.
     */
    for (i = 0; (pfr = index234(mgr->forwardings, i)) != NULL; i++)
        pfr->status = DESTROY;

    for (val = conf_get_str_strs(conf, CONF_portfwd, NULL, &key);
         val != NULL;
         val = conf_get_str_strs(conf, CONF_portfwd, key, &key)) {
        char *kp, *kp2, *vp, *vp2;
        char address_family, type;
        int sport, dport, sserv, dserv;
        char *sports, *dports, *saddr, *host;

        kp = key;

        address_family = 'A';
        type = 'L';
        if (*kp == 'A' || *kp == '4' || *kp == '6')
            address_family = *kp++;
        if (*kp == 'L' || *kp == 'R')
            type = *kp++;

        if ((kp2 = host_strchr(kp, ':')) != NULL) {
            /*
             * There's a colon in the middle of the source port
             * string, which means that the part before it is
             * actually a source address.
             */
            char *saddr_tmp = dupprintf("%.*s", (int)(kp2 - kp), kp);
            saddr = host_strduptrim(saddr_tmp);
            sfree(saddr_tmp);
            sports = kp2+1;
        } else {
            saddr = NULL;
            sports = kp;
        }
        sport = atoi(sports);
        sserv = 0;
        if (sport == 0) {
            sserv = 1;
            sport = net_service_lookup(sports);
            if (!sport) {
                logeventf(mgr->cl->logctx, "Service lookup failed for source"
                          " port \"%s\"", sports);
            }
        }

        if (type == 'L' && !strcmp(val, "D")) {
            /* dynamic forwarding */
            host = NULL;
            dports = NULL;
            dport = -1;
            dserv = 0;
            type = 'D';
        } else {
            /* ordinary forwarding */
            vp = val;
            vp2 = vp + host_strcspn(vp, ":");
            host = dupprintf("%.*s", (int)(vp2 - vp), vp);
            if (*vp2)
                vp2++;
            dports = vp2;
            dport = atoi(dports);
            dserv = 0;
            if (dport == 0) {
                dserv = 1;
                dport = net_service_lookup(dports);
                if (!dport) {
                    logeventf(mgr->cl->logctx,
                              "Service lookup failed for destination"
                              " port \"%s\"", dports);
                }
            }
        }

        if (sport && dport) {
            /* Set up a description of the source port. */
            pfr = snew(PortFwdRecord);
            pfr->type = type;
            pfr->saddr = saddr;
            pfr->sserv = sserv ? dupstr(sports) : NULL;
            pfr->sport = sport;
            pfr->daddr = host;
            pfr->dserv = dserv ? dupstr(dports) : NULL;
            pfr->dport = dport;
            pfr->local = NULL;
            pfr->remote = NULL;
            pfr->addressfamily = (address_family == '4' ? ADDRTYPE_IPV4 :
                                  address_family == '6' ? ADDRTYPE_IPV6 :
                                  ADDRTYPE_UNSPEC);

            PortFwdRecord *existing = add234(mgr->forwardings, pfr);
            if (existing != pfr) {
                if (existing->status == DESTROY) {
                    /*
                     * We already have a port forwarding up and running
                     * with precisely these parameters. Hence, no need
                     * to do anything; simply re-tag the existing one
                     * as KEEP.
                     */
                    existing->status = KEEP;
                }
                /*
                 * Anything else indicates that there was a duplicate
                 * in our input, which we'll silently ignore.
                 */
                pfr_free(pfr);
            } else {
                pfr->status = CREATE;
            }
        } else {
            sfree(saddr);
            sfree(host);
        }
    }

    /*
     * Now go through and destroy any port forwardings which were
     * not re-enabled.
     */
    for (i = 0; (pfr = index234(mgr->forwardings, i)) != NULL; i++) {
        if (pfr->status == DESTROY) {
            char *message;

            message = dupprintf("%s port forwarding from %s%s%d",
                                pfr->type == 'L' ? "local" :
                                pfr->type == 'R' ? "remote" : "dynamic",
                                pfr->saddr ? pfr->saddr : "",
                                pfr->saddr ? ":" : "",
                                pfr->sport);

            if (pfr->type != 'D') {
                char *msg2 = dupprintf("%s to %s:%d", message,
                                       pfr->daddr, pfr->dport);
                sfree(message);
                message = msg2;
            }

            logeventf(mgr->cl->logctx, "Cancelling %s", message);
            sfree(message);

            /* pfr->remote or pfr->local may be NULL if setting up a
             * forwarding failed. */
            if (pfr->remote) {
                /*
                 * Cancel the port forwarding at the server
                 * end.
                 *
                 * Actually closing the listening port on the server
                 * side may fail - because in SSH-1 there's no message
                 * in the protocol to request it!
                 *
                 * Instead, we simply remove the record of the
                 * forwarding from our local end, so that any
                 * connections the server tries to make on it are
                 * rejected.
                 */
                ssh_rportfwd_remove(mgr->cl, pfr->remote);
                pfr->remote = NULL;
            } else if (pfr->local) {
                pfl_terminate(pfr->local);
                pfr->local = NULL;
            }

            delpos234(mgr->forwardings, i);
            pfr_free(pfr);
            i--;                       /* so we don't skip one in the list */
        }
    }

    /*
     * And finally, set up any new port forwardings (status==CREATE).
     */
    for (i = 0; (pfr = index234(mgr->forwardings, i)) != NULL; i++) {
        if (pfr->status == CREATE) {
            char *sportdesc, *dportdesc;
            sportdesc = dupprintf("%s%s%s%s%d%s",
                                  pfr->saddr ? pfr->saddr : "",
                                  pfr->saddr ? ":" : "",
                                  pfr->sserv ? pfr->sserv : "",
                                  pfr->sserv ? "(" : "",
                                  pfr->sport,
                                  pfr->sserv ? ")" : "");
            if (pfr->type == 'D') {
                dportdesc = NULL;
            } else {
                dportdesc = dupprintf("%s:%s%s%d%s",
                                      pfr->daddr,
                                      pfr->dserv ? pfr->dserv : "",
                                      pfr->dserv ? "(" : "",
                                      pfr->dport,
                                      pfr->dserv ? ")" : "");
            }

            if (pfr->type == 'L') {
                char *err = pfl_listen(pfr->daddr, pfr->dport,
                                       pfr->saddr, pfr->sport,
                                       mgr->cl, conf, &pfr->local,
                                       pfr->addressfamily);

                logeventf(mgr->cl->logctx,
                          "Local %sport %s forwarding to %s%s%s",
                          pfr->addressfamily == ADDRTYPE_IPV4 ? "IPv4 " :
                          pfr->addressfamily == ADDRTYPE_IPV6 ? "IPv6 " : "",
                          sportdesc, dportdesc,
                          err ? " failed: " : "", err ? err : "");
                if (err)
                    sfree(err);
            } else if (pfr->type == 'D') {
                char *err = pfl_listen(NULL, -1, pfr->saddr, pfr->sport,
                                       mgr->cl, conf, &pfr->local,
                                       pfr->addressfamily);

                logeventf(mgr->cl->logctx,
                          "Local %sport %s SOCKS dynamic forwarding%s%s",
                          pfr->addressfamily == ADDRTYPE_IPV4 ? "IPv4 " :
                          pfr->addressfamily == ADDRTYPE_IPV6 ? "IPv6 " : "",
                          sportdesc,
                          err ? " failed: " : "", err ? err : "");

                if (err)
                    sfree(err);
            } else {
                const char *shost;

                if (pfr->saddr) {
                    shost = pfr->saddr;
                } else if (conf_get_bool(conf, CONF_rport_acceptall)) {
                    shost = "";
                } else {
                    shost = "localhost";
                }

                pfr->remote = ssh_rportfwd_alloc(
                    mgr->cl, shost, pfr->sport, pfr->daddr, pfr->dport,
                    pfr->addressfamily, sportdesc, pfr, NULL);

                if (!pfr->remote) {
                    logeventf(mgr->cl->logctx,
                              "Duplicate remote port forwarding to %s:%d",
                              pfr->daddr, pfr->dport);
                    pfr_free(pfr);
                } else {
                    logeventf(mgr->cl->logctx, "Requesting remote port %s"
                              " forward to %s", sportdesc, dportdesc);
                }
            }
            sfree(sportdesc);
            sfree(dportdesc);
        }
    }
}